

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.hpp
# Opt level: O2

void __thiscall OpenMD::AtomType::addZig(AtomType *this,AtomType *at)

{
  AtomType *local_8;
  
  local_8 = at;
  std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::push_back
            (&this->everyZIG,&local_8);
  return;
}

Assistant:

void addZig(AtomType* at) { everyZIG.push_back(at); }